

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setLeaveBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  pointer pnVar10;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 *puVar20;
  double *pdVar21;
  pointer pnVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined5 uStack_60;
  undefined3 uStack_5b;
  uint local_58;
  undefined4 uStack_54;
  int local_50;
  bool local_4c;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[n]) {
  case P_FIXED:
    ::soplex::infinity::__tls_init();
    pdVar21 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_38 = *pdVar21;
    uStack_30 = 0;
    local_48 = 0xa00000000;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_5b = 0;
    local_58 = 0;
    uStack_54 = 0;
    local_50 = 0;
    local_4c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-local_38);
    pnVar22 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pnVar22[i].m_backend.data = local_78;
    *(undefined8 *)((long)&pnVar22[i].m_backend.data + 8) = uStack_70;
    puVar1 = (uint *)((long)&pnVar22[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_68;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_5b,uStack_60);
    *(ulong *)((long)&pnVar22[i].m_backend.data + 0x20) = CONCAT44(uStack_54,local_58);
    pnVar22[i].m_backend.exp = local_50;
    pnVar22[i].m_backend.neg = local_4c;
    pnVar22[i].m_backend.fpclass = (undefined4)local_48;
    pnVar22[i].m_backend.prec_elem = local_48._4_4_;
    ::soplex::infinity::__tls_init();
    uVar23 = (undefined4)local_38;
    uVar24 = local_38._4_4_;
    break;
  default:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = pnVar22[n].m_backend.fpclass;
    uVar14 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar9 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar9;
    pnVar10[i].m_backend.prec_elem = uVar14;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_0029c326;
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    pdVar21 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_48 = 0xa00000000;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_5b = 0;
    local_58 = 0;
    uStack_54 = 0;
    local_50 = 0;
    local_4c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,-*pdVar21);
    pnVar22 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pnVar22[i].m_backend.data = local_78;
    *(undefined8 *)((long)&pnVar22[i].m_backend.data + 8) = uStack_70;
    puVar1 = (uint *)((long)&pnVar22[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_68;
    *(ulong *)(puVar1 + 2) = CONCAT35(uStack_5b,uStack_60);
    *(ulong *)((long)&pnVar22[i].m_backend.data + 0x20) = CONCAT44(uStack_54,local_58);
    pnVar22[i].m_backend.exp = local_50;
    pnVar22[i].m_backend.neg = local_4c;
    pnVar22[i].m_backend.fpclass = (undefined4)local_48;
    pnVar22[i].m_backend.prec_elem = local_48._4_4_;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = pnVar22[n].m_backend.fpclass;
    uVar12 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar7 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar7;
    pnVar10[i].m_backend.prec_elem = uVar12;
    return;
  case P_ON_UPPER:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    local_58 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    local_68 = *(undefined8 *)puVar1;
    uVar15 = *(undefined8 *)(puVar1 + 2);
    uStack_60 = (undefined5)uVar15;
    uStack_5b = (undefined3)((ulong)uVar15 >> 0x28);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar16 = *(undefined8 *)puVar1;
    uVar17 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = pnVar22[n].m_backend.fpclass;
    uVar11 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    local_78._0_4_ = (uint)uVar16;
    local_78._4_4_ = (uint)((ulong)uVar16 >> 0x20);
    uStack_70._0_4_ = (uint)uVar17;
    uStack_70._4_4_ = (uint)((ulong)uVar17 >> 0x20);
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *puVar1 = (uint)local_78;
    puVar1[1] = local_78._4_4_;
    puVar1[2] = (uint)uStack_70;
    puVar1[3] = uStack_70._4_4_;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = local_68;
    *(undefined8 *)(puVar1 + 2) = uVar15;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = local_58;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar6 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar6;
    pnVar10[i].m_backend.prec_elem = uVar11;
    local_78 = uVar16;
    uStack_70 = uVar17;
    ::soplex::infinity::__tls_init();
    puVar20 = (undefined8 *)__tls_get_addr(&PTR_003b4b70);
    uVar23 = (int)*puVar20;
    uVar24 = (int)((ulong)*puVar20 >> 0x20);
    break;
  case P_FREE:
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar15 = *(undefined8 *)puVar1;
    uVar16 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar17 = *(undefined8 *)puVar1;
    uVar18 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = pnVar22[n].m_backend.fpclass;
    uVar13 = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)&pnVar10[i].m_backend.data = iVar3;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 4);
    *(undefined8 *)puVar1 = uVar17;
    *(undefined8 *)(puVar1 + 2) = uVar18;
    puVar1 = (uint *)((long)&pnVar10[i].m_backend.data + 0x14);
    *(undefined8 *)puVar1 = uVar15;
    *(undefined8 *)(puVar1 + 2) = uVar16;
    *(uint *)((long)&pnVar10[i].m_backend.data + 0x24) = uVar4;
    pnVar10[i].m_backend.exp = iVar5;
    pnVar10[i].m_backend.neg = (bool)((iVar3 != 0 || uVar8 != 0) ^ bVar2);
    pnVar10[i].m_backend.fpclass = uVar8;
    pnVar10[i].m_backend.prec_elem = uVar13;
    pnVar22 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_0029c326:
    iVar3 = *(int *)&pnVar22[n].m_backend.data;
    uVar4 = *(uint *)((long)&pnVar22[n].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 0x14);
    uVar16 = *(undefined8 *)puVar1;
    uVar17 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar22[n].m_backend.data + 4);
    uVar18 = *(undefined8 *)puVar1;
    uVar19 = *(undefined8 *)(puVar1 + 2);
    iVar5 = pnVar22[n].m_backend.exp;
    pnVar10 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15._0_4_ = pnVar22[n].m_backend.fpclass;
    uVar15._4_4_ = pnVar22[n].m_backend.prec_elem;
    bVar2 = pnVar22[n].m_backend.neg;
    *(int *)(pnVar10 + i) = iVar3;
    *(undefined8 *)((long)(pnVar10 + i) + 4) = uVar18;
    *(undefined8 *)((long)(pnVar10 + i) + 0xc) = uVar19;
    *(undefined8 *)((long)(pnVar10 + i) + 0x14) = uVar16;
    *(undefined8 *)((long)(pnVar10 + i) + 0x1c) = uVar17;
    *(uint *)((long)(pnVar10 + i) + 0x24) = uVar4;
    *(int *)((long)(pnVar10 + i) + 0x28) = iVar5;
    *(char *)((long)(pnVar10 + i) + 0x2c) = (iVar3 != 0 || (undefined4)uVar15 != 0) ^ bVar2;
    *(undefined8 *)((long)(pnVar10 + i) + 0x30) = uVar15;
    return;
  }
  uStack_54 = 0;
  local_48 = 0xa00000000;
  local_4c = false;
  local_50 = 0;
  local_58 = 0;
  uStack_5b = 0;
  uStack_60 = 0;
  local_68 = 0;
  uStack_70 = 0;
  local_78 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,(double)CONCAT44(uVar24,uVar23));
  pnVar22 = (this->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar22 + i) = local_78;
  *(undefined8 *)((long)(pnVar22 + i) + 8) = uStack_70;
  *(undefined8 *)((long)(pnVar22 + i) + 0x10) = local_68;
  *(ulong *)((long)(pnVar22 + i) + 0x18) = CONCAT35(uStack_5b,uStack_60);
  *(ulong *)((long)(pnVar22 + i) + 0x20) = CONCAT44(uStack_54,local_58);
  *(int *)((long)(pnVar22 + i) + 0x28) = local_50;
  *(bool *)((long)(pnVar22 + i) + 0x2c) = local_4c;
  *(undefined8 *)((long)(pnVar22 + i) + 0x30) = local_48;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = -this->maxRowObj(n);
      theUBbound[i] = -this->maxRowObj(n);
      break;

   default:
      assert(rep() == COLUMN);
      theLBbound[i] = -this->rhs(n);                // slacks !
      theUBbound[i] = -this->lhs(n);                // slacks !
      break;
   }
}